

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O3

charcount_t __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::UpdateLine
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,int32 *line,EncodedCharPtr start,
          EncodedCharPtr last,charcount_t ichStart,charcount_t ichEnd)

{
  byte *pbVar1;
  byte bVar2;
  char16 cVar3;
  DecodeOptions *options;
  int iVar4;
  charcount_t cVar5;
  charcount_t cVar6;
  byte *local_50;
  int *local_48;
  charcount_t local_3c;
  byte *local_38;
  EncodedCharPtr p;
  
  iVar4 = *line;
  local_48 = line;
  if (ichStart < ichEnd) {
    options = &(this->super_UTF8EncodingPolicyBase<false>).m_decodeOptions;
    cVar5 = ichStart;
    local_3c = ichEnd;
    local_38 = start;
    do {
      pbVar1 = local_38 + 1;
      if (last <= local_38) break;
      bVar2 = *local_38;
      cVar3 = (char16)bVar2;
      local_38 = pbVar1;
      if ((char)bVar2 < '\0') {
        cVar3 = utf8::DecodeTail((ushort)bVar2,&local_38,last,options,(bool *)0x0);
        ichEnd = local_3c;
      }
      cVar6 = cVar5 + 1;
      pbVar1 = local_38;
      if ((ushort)cVar3 < 0x2028) {
        if ((ushort)cVar3 != 10) {
          if (cVar3 != L'\r') {
            cVar5 = cVar6;
            if (cVar3 != L'\0') goto LAB_00f01b6a;
            break;
          }
          if (local_38 < last) {
            bVar2 = *local_38;
            cVar3 = (char16)bVar2;
            if ((char)bVar2 < '\0') {
              local_50 = local_38 + 1;
              cVar3 = utf8::DecodeTail((ushort)bVar2,&local_50,last,options,(bool *)0x0);
              ichEnd = local_3c;
            }
            pbVar1 = local_38;
            if (cVar3 == L'\n') {
              cVar6 = cVar5 + 2;
              pbVar1 = local_38 + 1;
              if ((local_38 < last) && (bVar2 = *local_38, (char)bVar2 < '\0')) {
                local_38 = pbVar1;
                utf8::DecodeTail((ushort)bVar2,&local_38,last,options,(bool *)0x0);
                ichEnd = local_3c;
                pbVar1 = local_38;
              }
            }
          }
        }
LAB_00f01b65:
        ichStart = cVar6;
        local_38 = pbVar1;
        iVar4 = iVar4 + 1;
        cVar5 = ichStart;
      }
      else {
        cVar5 = cVar6;
        if ((ushort)cVar3 - 0x2028 < 2) goto LAB_00f01b65;
      }
LAB_00f01b6a:
    } while (cVar5 < ichEnd);
  }
  *local_48 = iVar4;
  return ichStart;
}

Assistant:

charcount_t Scanner<EncodingPolicy>::UpdateLine(int32 &line, EncodedCharPtr start, EncodedCharPtr last, charcount_t ichStart, charcount_t ichEnd)
{
    EncodedCharPtr p = start;
    charcount_t ich = ichStart;
    int32 current = line;
    charcount_t lastStart = ichStart;

    while (ich < ichEnd)
    {
        ich++;
        switch (this->template ReadFull<false>(p, last))
        {
        case kchRET:
            if (this->PeekFull(p, last) == kchNWL)
            {
                ich++;
                this->template ReadFull<false>(p, last);
            }
            // fall-through

        case kchNWL:
        case kchLS:
        case kchPS:
            current++;
            lastStart = ich;
            break;

        case kchNUL:
            goto done;
        }
    }

done:
    line = current;
    return lastStart;
}